

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O2

void __thiscall
rengine::AllocationPool<rengine::TransformNode>::deallocate
          (AllocationPool<rengine::TransformNode> *this,TransformNode *t)

{
  uint uVar1;
  char *__assertion;
  uint uVar2;
  
  if (this->m_memory == (TransformNode *)0x0) {
    __assertion = "m_memory";
    uVar2 = 0x52;
  }
  else if (this->m_free == (uint *)0x0) {
    __assertion = "m_free";
    uVar2 = 0x53;
  }
  else if (this->m_nextFree == 0) {
    __assertion = "m_nextFree > 0";
    uVar2 = 0x54;
  }
  else {
    uVar2 = (uint)((ulong)((long)t - (long)this->m_memory) >> 7);
    if (uVar2 < this->m_poolSize) {
      uVar1 = this->m_nextFree - 1;
      this->m_nextFree = uVar1;
      this->m_free[uVar1] = uVar2;
      (**(t->super_Node).super_SignalEmitter._vptr_SignalEmitter)(t);
      return;
    }
    __assertion = "isAlloctated(t)";
    uVar2 = 0x55;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,uVar2,
                "void rengine::AllocationPool<rengine::TransformNode>::deallocate(T *) [T = rengine::TransformNode]"
               );
}

Assistant:

void deallocate(T *t) {
        assert(m_memory);
        assert(m_free);
        assert(m_nextFree > 0);
        assert(isAlloctated(t));

        unsigned pos = t - m_memory;

        --m_nextFree;
        m_free[m_nextFree] = pos;

        // Call the destructor...
        t->~T();
    }